

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bninchr(bstring b0,int pos,bstring b1)

{
  int iVar1;
  uchar *puVar2;
  uint uVar3;
  unsigned_long uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar9;
  charField chrs;
  charField local_60;
  ulong uVar8;
  
  if ((b0 != (bstring)0x0 && -1 < pos) && (puVar2 = b0->data, puVar2 != (uchar *)0x0)) {
    uVar8 = (ulong)(uint)pos;
    iVar1 = b0->slen;
    if ((pos < iVar1) && (iVar5 = buildCharField(&local_60,b1), -1 < iVar5)) {
      lVar6 = 0;
      do {
        uVar7 = *(uint *)((long)local_60.content + lVar6 * 8 + 4);
        uVar4 = local_60.content[lVar6 + 1];
        uVar3 = *(uint *)((long)local_60.content + lVar6 * 8 + 0xc);
        *(uint *)(local_60.content + lVar6) = (uint)local_60.content[lVar6] ^ 0xffffffff;
        *(uint *)((long)local_60.content + lVar6 * 8 + 4) = uVar7 ^ 0xffffffff;
        *(uint *)(local_60.content + lVar6 + 1) = (uint)uVar4 ^ 0xffffffff;
        *(uint *)((long)local_60.content + lVar6 * 8 + 0xc) = uVar3 ^ 0xffffffff;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 8);
      pbVar9 = puVar2 + uVar8;
      do {
        if (((uint)local_60.content[*pbVar9 >> 5] >> (*pbVar9 & 0x1f) & 1) != 0) {
          return (int)uVar8;
        }
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
        pbVar9 = pbVar9 + 1;
      } while ((int)uVar7 < iVar1);
    }
  }
  return -1;
}

Assistant:

int bninchr (const bstring b0, int pos, const bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL || 
	    b0->slen <= pos) return BSTR_ERR;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	invertCharField (&chrs);
	return binchrCF (b0->data, b0->slen, pos, &chrs);
}